

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testing2_640x480at60_25.175MHz_Dice.c
# Opt level: O3

int main(void)

{
  int iVar1;
  
  line = 0;
  iVar1 = 0x1e0;
  do {
    displayLine();
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  iVar1 = 10;
  do {
    blankingTime();
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  vSyncLine();
  vSyncLine();
  iVar1 = 0x20;
  do {
    blankingTime();
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  lastBlankingTime();
  return 0;
}

Assistant:

int main() {

    line = 0;

    // Display Scan Lines
    for(int j=0;j<480;j++) {
        displayLine();
    }

    // Front Porch Scan Lines
    for(int j=0;j<10;j++) {
        blankingTime();
    }

    // vSync Scan Lines
    for(int j=0;j<2;j++) {
        vSyncLine();
    }

    // Back Porch Scan Lines
    for(int j=0;j<32;j++) {
        blankingTime();
    }

    // Last Blanking Scan Line
    lastBlankingTime();

    return 0;
}